

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_map.h
# Opt level: O0

pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,_const_google::protobuf::json_internal::ResolverPool::Field_*>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::json_internal::ResolverPool::Field_*>_>_>::iterator,_bool>
* __thiscall
absl::lts_20240722::container_internal::
raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,google::protobuf::json_internal::ResolverPool::Field_const*>,absl::lts_20240722::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,google::protobuf::json_internal::ResolverPool::Field_const*>>>
::try_emplace_impl<int,google::protobuf::json_internal::ResolverPool::Field_const*>
          (pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,_const_google::protobuf::json_internal::ResolverPool::Field_*>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::json_internal::ResolverPool::Field_*>_>_>::iterator,_bool>
           *__return_storage_ptr__,void *this,int *k,Field **args)

{
  iterator iter;
  pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,_const_google::protobuf::json_internal::ResolverPool::Field_*>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::json_internal::ResolverPool::Field_*>_>_>::iterator,_bool>
  *res;
  tuple<int_&&> local_38;
  ctrl_t *local_30;
  anon_union_8_1_a8a14541_for_iterator_2 local_28;
  Field **local_20;
  Field **args_local;
  int *k_local;
  raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,_const_google::protobuf::json_internal::ResolverPool::Field_*>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::json_internal::ResolverPool::Field_*>_>_>
  *this_local;
  
  local_20 = args;
  args_local = (Field **)k;
  k_local = (int *)this;
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,_const_google::protobuf::json_internal::ResolverPool::Field_*>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::json_internal::ResolverPool::Field_*>_>_>
  ::find_or_prepare_insert<int>
            (__return_storage_ptr__,
             (raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,_const_google::protobuf::json_internal::ResolverPool::Field_*>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::json_internal::ResolverPool::Field_*>_>_>
              *)this,k);
  if ((__return_storage_ptr__->second & 1U) != 0) {
    local_30 = (__return_storage_ptr__->first).ctrl_;
    local_28 = (anon_union_8_1_a8a14541_for_iterator_2)(__return_storage_ptr__->first).field_1.slot_
    ;
    std::forward_as_tuple<int>((int *)&local_38);
    std::forward_as_tuple<google::protobuf::json_internal::ResolverPool::Field_const*>
              ((Field **)&res);
    iter.field_1 = (anon_union_8_1_a8a14541_for_iterator_2)
                   (anon_union_8_1_a8a14541_for_iterator_2)local_28.slot_;
    iter.ctrl_ = local_30;
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,google::protobuf::json_internal::ResolverPool::Field_const*>,absl::lts_20240722::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,google::protobuf::json_internal::ResolverPool::Field_const*>>>
    ::
    emplace_at<std::piecewise_construct_t_const&,std::tuple<int&&>,std::tuple<google::protobuf::json_internal::ResolverPool::Field_const*&&>>
              ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,google::protobuf::json_internal::ResolverPool::Field_const*>,absl::lts_20240722::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,google::protobuf::json_internal::ResolverPool::Field_const*>>>
                *)this,iter,(piecewise_construct_t *)&std::piecewise_construct,&local_38,
               (tuple<const_google::protobuf::json_internal::ResolverPool::Field_*&&> *)&res);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> try_emplace_impl(K&& k, Args&&... args)
      ABSL_ATTRIBUTE_LIFETIME_BOUND {
    auto res = this->find_or_prepare_insert(k);
    if (res.second) {
      this->emplace_at(res.first, std::piecewise_construct,
                       std::forward_as_tuple(std::forward<K>(k)),
                       std::forward_as_tuple(std::forward<Args>(args)...));
    }
    return res;
  }